

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall cmListCommand::GetListString(cmListCommand *this,string *listString,string *var)

{
  char *pcVar1;
  char *__s;
  
  __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,var);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)listString->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)listString,0,pcVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

bool cmListCommand::GetListString(std::string& listString,
                                  const std::string& var)
{
  // get the old value
  const char* cacheValue
    = this->Makefile->GetDefinition(var);
  if(!cacheValue)
    {
    return false;
    }
  listString = cacheValue;
  return true;
}